

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluj.c
# Opt level: O3

int ffgsvuj(fitsfile *fptr,int colnum,int naxis,long *naxes,long *blc,long *trc,long *inc,
           unsigned_long nulval,unsigned_long *array,int *anynul,int *status)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  unsigned_long *array_00;
  long lVar7;
  bool bVar8;
  int local_378;
  char ldummy;
  long local_370;
  long local_368;
  long local_360;
  long local_358;
  long local_350;
  long local_348;
  long local_340;
  long local_338;
  long local_330;
  int hdutype;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_248;
  long local_240;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long str [9];
  long incr [9];
  long stp [9];
  LONGLONG dsize [10];
  LONGLONG blcll [9];
  
  if (naxis - 10U < 0xfffffff7) {
    snprintf((char *)blcll,0x51,"NAXIS = %d in call to ffgsvuj is out of range",(ulong)(uint)naxis);
    ffpmsg((char *)blcll);
    *status = 0x140;
    return 0x140;
  }
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 != 0) {
    memcpy(blcll,blc,(ulong)(uint)(naxis << 3));
    memcpy(dsize,trc,(ulong)(uint)(naxis << 3));
    str[0] = nulval;
    fits_read_compressed_img(fptr,0x28,blcll,dsize,inc,1,str,array,(char *)0x0,anynul,status);
LAB_001a82b7:
    return *status;
  }
  iVar1 = ffghdt(fptr,&hdutype,status);
  if (0 < iVar1) goto LAB_001a82b7;
  uVar2 = (ulong)(uint)naxis;
  if (hdutype == 0) {
    local_370 = (long)(int)(colnum + (uint)(colnum == 0));
    local_378 = 2;
    local_320 = 1;
    local_368 = local_370;
  }
  else {
    local_370 = blc[uVar2];
    local_368 = trc[uVar2];
    local_320 = inc[uVar2];
    local_378 = colnum;
  }
  if (anynul != (int *)0x0) {
    *anynul = 0;
  }
  lVar3 = 0;
  do {
    str[lVar3] = 1;
    stp[lVar3] = 1;
    incr[lVar3] = 1;
    dsize[lVar3] = 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 9);
  if (naxis != 0) {
    uVar4 = 1;
    do {
      lVar3 = trc[uVar4 - 1];
      if (lVar3 < blc[uVar4 - 1]) {
        snprintf((char *)blcll,0x51,"ffgsvuj: illegal range specified for axis %ld");
        ffpmsg((char *)blcll);
        *status = 0x141;
        return 0x141;
      }
      str[uVar4 - 1] = blc[uVar4 - 1];
      stp[uVar4 - 1] = lVar3;
      incr[uVar4 - 1] = inc[uVar4 - 1];
      dsize[uVar4] = naxes[uVar4 - 1] * dsize[uVar4 - 1];
      bVar8 = uVar4 != uVar2;
      uVar4 = uVar4 + 1;
    } while (bVar8);
    if ((naxis == 1) && (*naxes == 1)) {
      lVar3 = (local_368 - local_370) / local_320;
      local_368 = local_370;
      local_288 = local_320;
      goto LAB_001a8453;
    }
  }
  lVar3 = (stp[0] - str[0]) / *inc;
  local_288 = incr[0];
LAB_001a8453:
  if (local_370 <= local_368) {
    local_2a8 = str[8];
    local_2b0 = str[7];
    local_2e8 = str[6];
    local_2b8 = str[5];
    local_1f8 = str[1];
    local_280 = (str[1] + -1) * dsize[1] + (str[2] + -1) * dsize[2] + (str[3] + -1) * dsize[3] +
                (str[4] + -1) * dsize[4] +
                (str[5] + -1) * dsize[5] + (str[6] + -1) * dsize[6] + (str[7] + -1) * dsize[7] +
                (str[8] + -1) * dsize[8] + str[0];
    local_1d8 = lVar3 * 8 + 8;
    local_270 = incr[8];
    local_268 = dsize[8] * incr[8];
    local_260 = incr[7];
    local_258 = dsize[7] * incr[7];
    local_250 = incr[6];
    local_248 = dsize[6] * incr[6];
    local_240 = incr[5];
    local_358 = dsize[5] * incr[5];
    local_238 = incr[4];
    local_350 = dsize[4] * incr[4];
    local_230 = incr[3];
    local_228 = dsize[3] * incr[3];
    local_210 = incr[2];
    local_208 = dsize[2] * incr[2];
    local_1e0 = incr[1];
    local_1d0 = dsize[1] * incr[1];
    local_2e0 = stp[7];
    local_2d8 = stp[6];
    local_2d0 = stp[5];
    local_2c8 = stp[4];
    local_2c0 = stp[3];
    local_360 = stp[1];
    local_290 = stp[2];
    lVar6 = 0;
    local_2a0 = str[4];
    local_298 = str[3];
    local_200 = str[2];
    local_278 = stp[8];
    do {
      if (str[8] <= stp[8]) {
        local_348 = local_280;
        local_318 = str[8];
        do {
          lVar5 = local_348;
          local_310 = str[7];
          if (str[7] <= local_2e0) {
            do {
              if (local_2e8 <= local_2d8) {
                local_308 = local_2e8;
                lVar7 = lVar5;
                local_220 = lVar5;
                do {
                  local_340 = lVar7;
                  local_300 = str[5];
                  local_218 = lVar7;
                  if (str[5] <= local_2d0) {
                    do {
                      if (str[4] <= local_2c8) {
                        local_338 = local_340;
                        local_2f8 = str[4];
                        do {
                          if (str[3] <= local_2c0) {
                            local_330 = local_338;
                            local_1f0 = str[2];
                            local_2f0 = str[3];
                            do {
                              str[2] = local_1f0;
                              lVar5 = local_330;
                              if (local_1f0 <= local_290) {
                                do {
                                  local_1e8 = lVar5;
                                  if (local_1f8 <= local_360) {
                                    array_00 = array + lVar6;
                                    lVar7 = local_1f8;
                                    do {
                                      iVar1 = ffgcluj(fptr,local_378,local_370,lVar5,lVar3 + 1,
                                                      local_288,1,nulval,array_00,&ldummy,
                                                      (int *)blcll,status);
                                      if (0 < iVar1) {
                                        return *status;
                                      }
                                      if ((anynul != (int *)0x0) && ((int)blcll[0] != 0)) {
                                        *anynul = 1;
                                      }
                                      lVar6 = lVar6 + lVar3 + 1;
                                      lVar7 = lVar7 + local_1e0;
                                      array_00 = (unsigned_long *)((long)array_00 + local_1d8);
                                      lVar5 = lVar5 + local_1d0;
                                    } while (lVar7 <= local_360);
                                  }
                                  local_1f0 = local_1f0 + local_210;
                                  str[3] = local_298;
                                  str[2] = local_200;
                                  lVar5 = local_1e8 + local_208;
                                  str[8] = local_2a8;
                                  str[7] = local_2b0;
                                  str[4] = local_2a0;
                                  str[5] = local_2b8;
                                } while (local_1f0 <= local_290);
                              }
                              local_2f0 = local_2f0 + local_230;
                              local_330 = local_330 + local_228;
                              lVar5 = local_220;
                              local_1f0 = str[2];
                              lVar7 = local_218;
                            } while (local_2f0 <= local_2c0);
                          }
                          local_2f8 = local_2f8 + local_238;
                          local_338 = local_338 + local_350;
                        } while (local_2f8 <= local_2c8);
                      }
                      local_300 = local_300 + local_240;
                      str[3] = local_298;
                      local_340 = local_340 + local_358;
                    } while (local_300 <= local_2d0);
                  }
                  local_308 = local_308 + local_250;
                  lVar7 = lVar7 + local_248;
                  str[4] = local_2a0;
                } while (local_308 <= local_2d8);
              }
              local_310 = local_310 + local_260;
              lVar5 = lVar5 + local_258;
            } while (local_310 <= local_2e0);
          }
          local_318 = local_318 + local_270;
          local_348 = local_348 + local_268;
          stp[8] = local_278;
        } while (local_318 <= local_278);
      }
      local_370 = local_370 + local_320;
    } while (local_370 <= local_368);
  }
  return *status;
}

Assistant:

int ffgsvuj(fitsfile *fptr, /* I - FITS file pointer                         */
           int  colnum,    /* I - number of the column to read (1 = 1st)    */
           int naxis,      /* I - number of dimensions in the FITS array    */
           long  *naxes,   /* I - size of each dimension                    */
           long  *blc,     /* I - 'bottom left corner' of the subsection    */
           long  *trc,     /* I - 'top right corner' of the subsection      */
           long  *inc,     /* I - increment to be applied in each dimension */
  unsigned long nulval,    /* I - value to set undefined pixels             */
  unsigned long *array,    /* O - array to be filled and returned           */
           int  *anynul,   /* O - set to 1 if any values are null; else 0   */
           int  *status)   /* IO - error status                             */
/*
  Read a subsection of data values from an image or a table column.
  This routine is set up to handle a maximum of nine dimensions.
*/
{
    long ii,i0, i1,i2,i3,i4,i5,i6,i7,i8,row,rstr,rstp,rinc;
    long str[9],stp[9],incr[9];
    long nelem, nultyp, ninc, numcol;
    LONGLONG felem, dsize[10], blcll[9], trcll[9];
    int hdutype, anyf;
    char ldummy, msg[FLEN_ERRMSG];
    int nullcheck = 1;
    unsigned long nullvalue;

    if (naxis < 1 || naxis > 9)
    {
        snprintf(msg, FLEN_ERRMSG,"NAXIS = %d in call to ffgsvuj is out of range", naxis);
        ffpmsg(msg);
        return(*status = BAD_DIMEN);
    }

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        for (ii=0; ii < naxis; ii++) {
	    blcll[ii] = blc[ii];
	    trcll[ii] = trc[ii];
	}

        nullvalue = nulval;  /* set local variable */

        fits_read_compressed_img(fptr, TULONG, blcll, trcll, inc,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }

/*
    if this is a primary array, then the input COLNUM parameter should
    be interpreted as the row number, and we will alway read the image
    data from column 2 (any group parameters are in column 1).
*/
    if (ffghdt(fptr, &hdutype, status) > 0)
        return(*status);

    if (hdutype == IMAGE_HDU)
    {
        /* this is a primary array, or image extension */
        if (colnum == 0)
        {
            rstr = 1;
            rstp = 1;
        }
        else
        {
            rstr = colnum;
            rstp = colnum;
        }
        rinc = 1;
        numcol = 2;
    }
    else
    {
        /* this is a table, so the row info is in the (naxis+1) elements */
        rstr = blc[naxis];
        rstp = trc[naxis];
        rinc = inc[naxis];
        numcol = colnum;
    }

    nultyp = 1;
    if (anynul)
        *anynul = FALSE;

    i0 = 0;
    for (ii = 0; ii < 9; ii++)
    {
        str[ii] = 1;
        stp[ii] = 1;
        incr[ii] = 1;
        dsize[ii] = 1;
    }

    for (ii = 0; ii < naxis; ii++)
    {
      if (trc[ii] < blc[ii])
      {
        snprintf(msg, FLEN_ERRMSG,"ffgsvuj: illegal range specified for axis %ld", ii + 1);
        ffpmsg(msg);
        return(*status = BAD_PIX_NUM);
      }

      str[ii] = blc[ii];
      stp[ii] = trc[ii];
      incr[ii] = inc[ii];
      dsize[ii + 1] = dsize[ii] * naxes[ii];
    }

    if (naxis == 1 && naxes[0] == 1)
    {
      /* This is not a vector column, so read all the rows at once */
      nelem = (rstp - rstr) / rinc + 1;
      ninc = rinc;
      rstp = rstr;
    }
    else
    {
      /* have to read each row individually, in all dimensions */
      nelem = (stp[0] - str[0]) / inc[0] + 1;
      ninc = incr[0];
    }

    for (row = rstr; row <= rstp; row += rinc)
    {
     for (i8 = str[8]; i8 <= stp[8]; i8 += incr[8])
     {
      for (i7 = str[7]; i7 <= stp[7]; i7 += incr[7])
      {
       for (i6 = str[6]; i6 <= stp[6]; i6 += incr[6])
       {
        for (i5 = str[5]; i5 <= stp[5]; i5 += incr[5])
        {
         for (i4 = str[4]; i4 <= stp[4]; i4 += incr[4])
         {
          for (i3 = str[3]; i3 <= stp[3]; i3 += incr[3])
          {
           for (i2 = str[2]; i2 <= stp[2]; i2 += incr[2])
           {
            for (i1 = str[1]; i1 <= stp[1]; i1 += incr[1])
            {
              felem=str[0] + (i1 - 1) * dsize[1] + (i2 - 1) * dsize[2] + 
                             (i3 - 1) * dsize[3] + (i4 - 1) * dsize[4] +
                             (i5 - 1) * dsize[5] + (i6 - 1) * dsize[6] +
                             (i7 - 1) * dsize[7] + (i8 - 1) * dsize[8];

              if ( ffgcluj(fptr, numcol, row, felem, nelem, ninc, nultyp,
                   nulval, &array[i0], &ldummy, &anyf, status) > 0)
                   return(*status);

              if (anyf && anynul)
                  *anynul = TRUE;

              i0 += nelem;
            }
           }
          }
         }
        }
       }
      }
     }
    }
    return(*status);
}